

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiber.c
# Opt level: O0

void fiber_destroy(Fiber *fbr)

{
  _Bool _Var1;
  size_t sVar2;
  ulong local_20;
  size_t npages;
  size_t pgsz;
  Fiber *fbr_local;
  
  _Var1 = fiber_is_executing(fbr);
  if (_Var1) {
    __assert_fail("!fiber_is_executing(fbr)",
                  "/workspace/llm4binary/github/license_c_cmakelists/simonfxr[P]fiber/src/fiber.c",
                  0xee,"void fiber_destroy(Fiber *)");
  }
  _Var1 = fiber_is_toplevel(fbr);
  if (_Var1) {
    __assert_fail("!fiber_is_toplevel(fbr)",
                  "/workspace/llm4binary/github/license_c_cmakelists/simonfxr[P]fiber/src/fiber.c",
                  0xef,"void fiber_destroy(Fiber *)");
  }
  if (fbr->alloc_stack != (void *)0x0) {
    if ((fbr->state & 0x18) == 0) {
      free(fbr->alloc_stack);
    }
    else {
      sVar2 = get_page_size();
      local_20 = ((fbr->stack_size + sVar2) - 1) / sVar2;
      if ((fbr->state & 8) != 0) {
        local_20 = local_20 + 1;
        protect_page(fbr->alloc_stack,true);
      }
      if ((fbr->state & 0x10) != 0) {
        protect_page((void *)((long)fbr->alloc_stack + local_20 * sVar2),true);
      }
      free_pages(fbr->alloc_stack);
    }
    fbr->stack = (void *)0x0;
    fbr->stack_size = 0;
    (fbr->regs).sp = (void *)0x0;
    fbr->alloc_stack = (void *)0x0;
  }
  return;
}

Assistant:

void
fiber_destroy(Fiber *fbr)
{
    assert(!fiber_is_executing(fbr));
    assert(!fiber_is_toplevel(fbr));

    if (!fbr->alloc_stack)
        return;

    if (fbr->state &
        (FIBER_FS_HAS_HI_GUARD_PAGE | FIBER_FS_HAS_LO_GUARD_PAGE)) {
        size_t pgsz = get_page_size();
        size_t npages = (fbr->stack_size + pgsz - 1) / pgsz;
        if (fbr->state & FIBER_FS_HAS_LO_GUARD_PAGE) {
            ++npages;
            protect_page(fbr->alloc_stack, true);
        }

        if (fbr->state & FIBER_FS_HAS_HI_GUARD_PAGE) {
            protect_page((char *) fbr->alloc_stack + npages * pgsz, true);
        }

        free_pages(fbr->alloc_stack);
    } else {
        free(fbr->alloc_stack);
    }

    fbr->stack = NULL;
    fbr->stack_size = 0;
    fbr->regs.sp = NULL;
    fbr->alloc_stack = NULL;
}